

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# diyfp.h
# Opt level: O1

DiyFp rapidjson::internal::GetCachedPower10(int exp,int *outExp)

{
  RapidJSONException *this;
  uint uVar1;
  DiyFp DVar2;
  
  if (exp < -0x15c) {
    this = (RapidJSONException *)__cxa_allocate_exception(0x10);
    cereal::RapidJSONException::RapidJSONException
              (this,"rapidjson internal assertion failure: exp >= -348");
  }
  else {
    uVar1 = exp + 0x15c;
    *outExp = (uVar1 & 0xfffffff8) - 0x15c;
    if (uVar1 < 0x2b8) {
      DVar2.e = (int)*(short *)(GetCachedPowerByIndex(unsigned_long)::kCachedPowers_E +
                               (ulong)(uVar1 >> 3) * 2);
      DVar2.f = *(undefined8 *)
                 (GetCachedPowerByIndex(unsigned_long)::kCachedPowers_F + (uVar1 & 0xfffffff8));
      DVar2._12_4_ = 0;
      return DVar2;
    }
    this = (RapidJSONException *)__cxa_allocate_exception(0x10);
    cereal::RapidJSONException::RapidJSONException
              (this,"rapidjson internal assertion failure: index < 87");
  }
  __cxa_throw(this,&cereal::RapidJSONException::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

inline DiyFp GetCachedPower10(int exp, int *outExp) {
    CEREAL_RAPIDJSON_ASSERT(exp >= -348);
    unsigned index = static_cast<unsigned>(exp + 348) / 8u;
    *outExp = -348 + static_cast<int>(index) * 8;
    return GetCachedPowerByIndex(index);
}